

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O2

void __thiscall
llvm::dwarf::CFIProgram::dump
          (CFIProgram *this,raw_ostream *OS,MCRegisterInfo *MRI,bool IsEH,uint IndentLevel)

{
  uint uVar1;
  pointer pIVar2;
  raw_ostream *this_00;
  const_reference puVar3;
  size_type idx;
  Instruction *Instr;
  pointer Instr_00;
  uint uVar4;
  StringRef Str;
  
  pIVar2 = (this->Instructions).
           super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (Instr_00 = (this->Instructions).
                  super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_start; Instr_00 != pIVar2;
      Instr_00 = Instr_00 + 1) {
    uVar1 = *(uint *)Instr_00;
    uVar4 = (uint)((byte)uVar1 & 0xc0);
    if ((uVar1 & 0xc0) == 0) {
      uVar4 = uVar1;
    }
    raw_ostream::indent(OS,IndentLevel * 2);
    Str = CallFrameString(uVar4 & 0xff,this->Arch);
    this_00 = raw_ostream::operator<<(OS,Str);
    raw_ostream::operator<<(this_00,":");
    for (idx = 0; (uint)idx <
                  (Instr_00->Ops).super_SmallVectorImpl<unsigned_long>.
                  super_SmallVectorTemplateBase<unsigned_long,_true>.
                  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size;
        idx = idx + 1) {
      puVar3 = SmallVectorTemplateCommon<unsigned_long,_void>::operator[]
                         ((SmallVectorTemplateCommon<unsigned_long,_void> *)&Instr_00->Ops,idx);
      printOperand(this,OS,MRI,IsEH,Instr_00,(uint)idx,*puVar3);
    }
    raw_ostream::operator<<(OS,'\n');
  }
  return;
}

Assistant:

void CFIProgram::dump(raw_ostream &OS, const MCRegisterInfo *MRI, bool IsEH,
                      unsigned IndentLevel) const {
  for (const auto &Instr : Instructions) {
    uint8_t Opcode = Instr.Opcode;
    if (Opcode & DWARF_CFI_PRIMARY_OPCODE_MASK)
      Opcode &= DWARF_CFI_PRIMARY_OPCODE_MASK;
    OS.indent(2 * IndentLevel);
    OS << CallFrameString(Opcode, Arch) << ":";
    for (unsigned i = 0; i < Instr.Ops.size(); ++i)
      printOperand(OS, MRI, IsEH, Instr, i, Instr.Ops[i]);
    OS << '\n';
  }
}